

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O3

int cpu_breakpoint_insert_x86_64(CPUState *cpu,vaddr pc,int flags,CPUBreakpoint **breakpoint)

{
  QTailQLink *pQVar1;
  CPUBreakpoint *pCVar2;
  anon_union_16_2_aaf24f3d_for_entry *paVar3;
  CPUBreakpoint *pCVar4;
  
  pCVar4 = (CPUBreakpoint *)g_malloc(0x20);
  pCVar4->pc = pc;
  pCVar4->flags = flags;
  if ((flags & 0x10U) == 0) {
    (pCVar4->entry).tqe_next = (CPUBreakpoint *)0x0;
    pQVar1 = (cpu->breakpoints).tqh_circ.tql_prev;
    (pCVar4->entry).tqe_circ.tql_prev = pQVar1;
    pQVar1->tql_next = pCVar4;
    (cpu->breakpoints).tqh_circ.tql_prev = (QTailQLink *)&pCVar4->entry;
  }
  else {
    pCVar2 = (cpu->breakpoints).tqh_first;
    paVar3 = &pCVar2->entry;
    if (pCVar2 == (CPUBreakpoint *)0x0) {
      paVar3 = (anon_union_16_2_aaf24f3d_for_entry *)&cpu->breakpoints;
    }
    (pCVar4->entry).tqe_next = pCVar2;
    (paVar3->tqe_circ).tql_prev = (QTailQLink *)&pCVar4->entry;
    (cpu->breakpoints).tqh_first = pCVar4;
    (pCVar4->entry).tqe_circ.tql_prev = (QTailQLink *)&cpu->breakpoints;
  }
  tb_flush_x86_64(cpu);
  if (breakpoint != (CPUBreakpoint **)0x0) {
    *breakpoint = pCVar4;
  }
  return 0;
}

Assistant:

int cpu_breakpoint_insert(CPUState *cpu, vaddr pc, int flags,
                          CPUBreakpoint **breakpoint)
{
    CPUBreakpoint *bp;

    bp = g_malloc(sizeof(*bp));

    bp->pc = pc;
    bp->flags = flags;

    /* keep all GDB-injected breakpoints in front */
    if (flags & BP_GDB) {
        QTAILQ_INSERT_HEAD(&cpu->breakpoints, bp, entry);
    } else {
        QTAILQ_INSERT_TAIL(&cpu->breakpoints, bp, entry);
    }

    breakpoint_invalidate(cpu, pc);

    if (breakpoint) {
        *breakpoint = bp;
    }
    return 0;
}